

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatsdClient.cpp
# Opt level: O0

void testSendRecv(uint64_t batchSize,uint64_t sendInterval)

{
  pointer *ppbVar1;
  pointer *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar2;
  ostream *poVar3;
  reference pbVar4;
  runtime_error *this_00;
  string *local_1d58;
  string *local_1d08;
  string *local_1cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *message_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *message;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  allocator local_1ad9;
  string local_1ad8 [39];
  allocator local_1ab1;
  string local_1ab0 [36];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8c;
  undefined1 local_1a8b;
  allocator local_1a8a;
  allocator local_1a89;
  string *local_1a88;
  string local_1a80 [32];
  string local_1a60 [32];
  iterator local_1a40;
  size_type local_1a38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a30;
  allocator local_1a11;
  string local_1a10 [39];
  allocator local_19e9;
  string local_19e8 [36];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_19c4;
  undefined1 local_19c3;
  allocator local_19c2;
  allocator local_19c1;
  string *local_19c0;
  string local_19b8 [32];
  string local_1998 [32];
  iterator local_1978;
  size_type local_1970;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1968;
  allocator local_1949;
  string local_1948 [39];
  allocator local_1921;
  string local_1920 [35];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18fd;
  undefined1 local_18fc;
  allocator local_18fb;
  allocator local_18fa;
  allocator local_18f9;
  string *local_18f8;
  string local_18f0 [32];
  string local_18d0 [32];
  string local_18b0 [32];
  iterator local_1890;
  size_type local_1888;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1880;
  allocator local_1861;
  string local_1860 [39];
  allocator local_1839;
  string local_1838 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1818;
  allocator local_17f1;
  string local_17f0 [39];
  allocator local_17c9;
  string local_17c8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17a8;
  allocator local_1781;
  string local_1780 [39];
  allocator local_1759;
  string local_1758 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1738;
  allocator local_1711;
  string local_1710 [39];
  allocator local_16e9;
  string local_16e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_16c8;
  allocator local_16a1;
  string local_16a0 [39];
  allocator local_1679;
  string local_1678 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1658;
  allocator local_1631;
  string local_1630 [39];
  allocator local_1609;
  string local_1608 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_15e8;
  allocator local_15c1;
  string local_15c0 [39];
  allocator local_1599;
  string local_1598 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1578;
  allocator local_1551;
  string local_1550 [39];
  allocator local_1529;
  string local_1528 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1508;
  allocator local_14e9;
  string local_14e8 [32];
  int local_14c8;
  allocator local_14c1;
  int i;
  allocator local_1499;
  string local_1498 [39];
  allocator local_1471;
  string local_1470 [32];
  undefined1 local_1450 [8];
  StatsdClient client;
  reference_wrapper<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  reference_wrapper<Statsd::StatsdServer> local_80;
  thread local_78;
  thread server;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  StatsdServer mock_server;
  uint64_t sendInterval_local;
  uint64_t batchSize_local;
  
  ppbVar1 = &messages.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Statsd::StatsdServer::StatsdServer((StatsdServer *)ppbVar1,0x1fbd);
  this = &expected.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&server);
  local_80 = std::ref<Statsd::StatsdServer>((StatsdServer *)ppbVar1);
  local_88 = std::ref<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this);
  std::thread::
  thread<void(&)(Statsd::StatsdServer&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),std::reference_wrapper<Statsd::StatsdServer>,std::reference_wrapper<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            (&local_78,mock,&local_80,&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1470,"localhost",&local_1471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1498,"sendRecv.",&local_1499);
  Statsd::StatsdClient::StatsdClient
            ((StatsdClient *)local_1450,(string *)local_1470,0x1fbd,(string *)local_1498,batchSize,
             sendInterval,3);
  std::__cxx11::string::~string(local_1498);
  std::allocator<char>::~allocator((allocator<char> *)&local_1499);
  std::__cxx11::string::~string(local_1470);
  std::allocator<char>::~allocator((allocator<char> *)&local_1471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"",&local_14c1);
  throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_14c1);
  for (local_14c8 = 0; local_14c8 < 3; local_14c8 = local_14c8 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_14e8,"coco",&local_14e9);
    local_1508.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1508.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1508.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1508);
    Statsd::StatsdClient::increment((StatsdClient *)local_1450,(string *)local_14e8,1.0,&local_1508)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1508);
    std::__cxx11::string::~string(local_14e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_14e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1528,"",&local_1529);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_1528);
    std::__cxx11::string::~string(local_1528);
    std::allocator<char>::~allocator((allocator<char> *)&local_1529);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[18]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&server,
               (char (*) [18])"sendRecv.coco:1|c");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1550,"kiki",&local_1551);
    local_1578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1578);
    Statsd::StatsdClient::decrement((StatsdClient *)local_1450,(string *)local_1550,1.0,&local_1578)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1578);
    std::__cxx11::string::~string(local_1550);
    std::allocator<char>::~allocator((allocator<char> *)&local_1551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1598,"",&local_1599);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_1598);
    std::__cxx11::string::~string(local_1598);
    std::allocator<char>::~allocator((allocator<char> *)&local_1599);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[19]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&server,
               (char (*) [19])"sendRecv.kiki:-1|c");
    Statsd::StatsdClient::seed((StatsdClient *)local_1450,0x13);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_15c0,"toto",&local_15c1);
    local_15e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_15e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_15e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_15e8);
    Statsd::StatsdClient::count((StatsdClient *)local_1450,(string *)local_15c0,2,0.1,&local_15e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_15e8);
    std::__cxx11::string::~string(local_15c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_15c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1608,"",&local_1609);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_1608);
    std::__cxx11::string::~string(local_1608);
    std::allocator<char>::~allocator((allocator<char> *)&local_1609);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[24]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&server,
               (char (*) [24])"sendRecv.toto:2|c|@0.10");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1630,"popo",&local_1631);
    local_1658.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1658.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1658.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1658);
    Statsd::StatsdClient::count((StatsdClient *)local_1450,(string *)local_1630,9,0.1,&local_1658);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1658);
    std::__cxx11::string::~string(local_1630);
    std::allocator<char>::~allocator((allocator<char> *)&local_1631);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1678,"",&local_1679);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_1678);
    std::__cxx11::string::~string(local_1678);
    std::allocator<char>::~allocator((allocator<char> *)&local_1679);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_16a0,"titi",&local_16a1);
    local_16c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_16c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_16c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_16c8);
    Statsd::StatsdClient::gauge<int>
              ((StatsdClient *)local_1450,(string *)local_16a0,3,1.0,&local_16c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_16c8);
    std::__cxx11::string::~string(local_16a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_16a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_16e8,"",&local_16e9);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_16e8);
    std::__cxx11::string::~string(local_16e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_16e9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[18]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&server,
               (char (*) [18])"sendRecv.titi:3|g");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1710,"titifloat",&local_1711);
    local_1738.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1738.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1738.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1738);
    Statsd::StatsdClient::gauge<double>
              ((StatsdClient *)local_1450,(string *)local_1710,-123.456789,1.0,&local_1738);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1738);
    std::__cxx11::string::~string(local_1710);
    std::allocator<char>::~allocator((allocator<char> *)&local_1711);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1758,"",&local_1759);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_1758);
    std::__cxx11::string::~string(local_1758);
    std::allocator<char>::~allocator((allocator<char> *)&local_1759);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[30]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&server,
               (char (*) [30])"sendRecv.titifloat:-123.457|g");
    Statsd::StatsdClient::seed((StatsdClient *)local_1450,0x13);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1780,"myTiming",&local_1781);
    local_17a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_17a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_17a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_17a8);
    Statsd::StatsdClient::timing((StatsdClient *)local_1450,(string *)local_1780,2,0.1,&local_17a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_17a8);
    std::__cxx11::string::~string(local_1780);
    std::allocator<char>::~allocator((allocator<char> *)&local_1781);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_17c8,"",&local_17c9);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_17c8);
    std::__cxx11::string::~string(local_17c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_17c9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[29]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&server,
               (char (*) [29])"sendRecv.myTiming:2|ms|@0.10");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_17f0,"tutu",&local_17f1);
    local_1818.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1818.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1818.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1818);
    Statsd::StatsdClient::set((StatsdClient *)local_1450,(string *)local_17f0,0x4cb,2.0,&local_1818)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1818);
    std::__cxx11::string::~string(local_17f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_17f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1838,"",&local_1839);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_1838);
    std::__cxx11::string::~string(local_1838);
    std::allocator<char>::~allocator((allocator<char> *)&local_1839);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[21]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&server,
               (char (*) [21])"sendRecv.tutu:1227|s");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1860,anon_var_dwarf_8474,&local_1861);
    local_18fc = 1;
    local_18f8 = local_18f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_18f0,"liegt",&local_18f9);
    local_18f8 = local_18d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_18d0,"im",&local_18fa);
    local_18f8 = local_18b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_18b0,anon_var_dwarf_84bc + 0x28,&local_18fb);
    local_18fc = 0;
    local_1890 = (iterator)local_18f0;
    local_1888 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_18fd);
    __l_01._M_len = local_1888;
    __l_01._M_array = local_1890;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1880,__l_01,&local_18fd);
    Statsd::StatsdClient::gauge<int>
              ((StatsdClient *)local_1450,(string *)local_1860,0x14d,1.0,&local_1880);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1880);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_18fd);
    local_1cb8 = (string *)&local_1890;
    do {
      local_1cb8 = local_1cb8 + -0x20;
      std::__cxx11::string::~string(local_1cb8);
    } while (local_1cb8 != local_18f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_18fb);
    std::allocator<char>::~allocator((allocator<char> *)&local_18fa);
    std::allocator<char>::~allocator((allocator<char> *)&local_18f9);
    std::__cxx11::string::~string(local_1860);
    std::allocator<char>::~allocator((allocator<char> *)&local_1861);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1920,"",&local_1921);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_1920);
    std::__cxx11::string::~string(local_1920);
    std::allocator<char>::~allocator((allocator<char> *)&local_1921);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[46]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&server,
               &anon_var_dwarf_84bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1948,"foo",&local_1949);
    local_19c3 = 1;
    local_19c0 = local_19b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_19b8,"bar",&local_19c1);
    local_19c0 = local_1998;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1998,"baz",&local_19c2);
    local_19c3 = 0;
    local_1978 = (iterator)local_19b8;
    local_1970 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_19c4);
    __l_00._M_len = local_1970;
    __l_00._M_array = local_1978;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1968,__l_00,&local_19c4);
    Statsd::StatsdClient::count
              ((StatsdClient *)local_1450,(string *)local_1948,-0x2a,0.9,&local_1968);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1968);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_19c4);
    local_1d08 = (string *)&local_1978;
    do {
      local_1d08 = local_1d08 + -0x20;
      std::__cxx11::string::~string(local_1d08);
    } while (local_1d08 != local_19b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_19c2);
    std::allocator<char>::~allocator((allocator<char> *)&local_19c1);
    std::__cxx11::string::~string(local_1948);
    std::allocator<char>::~allocator((allocator<char> *)&local_1949);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_19e8,"",&local_19e9);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_19e8);
    std::__cxx11::string::~string(local_19e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_19e9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[34]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&server,
               (char (*) [34])"sendRecv.foo:-42|c|@0.90|#bar,baz");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a10,"custom_metric_type",&local_1a11);
    local_1a8b = 1;
    local_1a88 = local_1a80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a80,"tag1",&local_1a89);
    local_1a88 = local_1a60;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a60,"tag2",&local_1a8a);
    local_1a8b = 0;
    local_1a40 = (iterator)local_1a80;
    local_1a38 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_1a8c);
    __l._M_len = local_1a38;
    __l._M_array = local_1a40;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1a30,__l,&local_1a8c);
    Statsd::StatsdClient::custom<int>
              ((StatsdClient *)local_1450,(string *)local_1a10,0x162e,"cust",0.95,&local_1a30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a30);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_1a8c);
    local_1d58 = (string *)&local_1a40;
    do {
      local_1d58 = local_1d58 + -0x20;
      std::__cxx11::string::~string(local_1d58);
    } while (local_1d58 != local_1a80);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a8a);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a89);
    std::__cxx11::string::~string(local_1a10);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ab0,"",&local_1ab1);
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_1450,true,(string *)local_1ab0);
    std::__cxx11::string::~string(local_1ab0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1ab1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[55]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&server,
               (char (*) [55])"sendRecv.custom_metric_type:5678|cust|@0.95|#tag1,tag2");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ad8,"DONE",&local_1ad9);
  memset(&__range2,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
  Statsd::StatsdClient::timing
            ((StatsdClient *)local_1450,(string *)local_1ad8,0,1.0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range2);
  std::__cxx11::string::~string(local_1ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ad9);
  if (sendInterval == 0) {
    Statsd::StatsdClient::flush((StatsdClient *)local_1450);
  }
  std::thread::join();
  bVar2 = std::operator!=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&expected.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&server);
  if (!bVar2) {
    Statsd::StatsdClient::~StatsdClient((StatsdClient *)local_1450);
    std::thread::~thread(&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&server);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&expected.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Statsd::StatsdServer::~StatsdServer
              ((StatsdServer *)
               &messages.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Unexpected stats received by server, got:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  ppbVar1 = &expected.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ppbVar1);
  message = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)ppbVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&message);
    if (!bVar2) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)pbVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"But we expected:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end2_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&server);
  message_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&server);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&message_1);
    if (!bVar2) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2_1);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)pbVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2_1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected stats");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void testSendRecv(uint64_t batchSize, uint64_t sendInterval) {
    StatsdServer mock_server;
    std::vector<std::string> messages, expected;
    std::thread server(mock, std::ref(mock_server), std::ref(messages));

    // Set a new config that has the client send messages to a proper address that can be resolved
    StatsdClient client("localhost", 8125, "sendRecv.", batchSize, sendInterval, 3);
    throwOnError(client);

    // TODO: I forget if we need to wait for the server to be ready here before sending the first stats
    //  is there a race condition where the client sending before the server binds would drop that clients message

    for (int i = 0; i < 3; ++i) {
        // Increment "coco"
        client.increment("coco");
        throwOnError(client);
        expected.emplace_back("sendRecv.coco:1|c");

        // Decrement "kiki"
        client.decrement("kiki");
        throwOnError(client);
        expected.emplace_back("sendRecv.kiki:-1|c");

        // Adjusts "toto" by +2
        client.seed(19);  // this seed gets a hit on the first call
        client.count("toto", 2, 0.1f);
        throwOnError(client);
        expected.emplace_back("sendRecv.toto:2|c|@0.10");

        // Gets "sampled out" by the random number generator
        client.count("popo", 9, 0.1f);
        throwOnError(client);

        // Record a gauge "titi" to 3
        client.gauge("titi", 3);
        throwOnError(client);
        expected.emplace_back("sendRecv.titi:3|g");

        // Record a gauge "titifloat" to -123.456789 with precision 3
        client.gauge("titifloat", -123.456789);
        throwOnError(client);
        expected.emplace_back("sendRecv.titifloat:-123.457|g");

        // Record a timing of 2ms for "myTiming"
        client.seed(19);
        client.timing("myTiming", 2, 0.1f);
        throwOnError(client);
        expected.emplace_back("sendRecv.myTiming:2|ms|@0.10");

        // Send a set with 1227 total uniques
        client.set("tutu", 1227, 2.0f);
        throwOnError(client);
        expected.emplace_back("sendRecv.tutu:1227|s");

        // Gauge but with tags
        client.gauge("dr.röstigrabe", 333, 1.f, {"liegt", "im", "weste"});
        throwOnError(client);
        expected.emplace_back("sendRecv.dr.röstigrabe:333|g|#liegt,im,weste");

        // All the things
        client.count("foo", -42, .9f, {"bar", "baz"});
        throwOnError(client);
        expected.emplace_back("sendRecv.foo:-42|c|@0.90|#bar,baz");

        // Custom metric type should pass through all params
        client.custom("custom_metric_type", 5678, "cust", .95f, {"tag1", "tag2"});
        throwOnError(client);
        expected.emplace_back("sendRecv.custom_metric_type:5678|cust|@0.95|#tag1,tag2");
    }

    // Signal the mock server we are done
    client.timing("DONE", 0);

    // If manual flushing do it now
    if (sendInterval == 0) {
        client.flush();
    }

    // Wait for the server to stop
    server.join();

    // Make sure we get the exactly correct output
    if (messages != expected) {
        std::cerr << "Unexpected stats received by server, got:" << std::endl;
        for (const auto& message : messages) {
            std::cerr << message << std::endl;
        }
        std::cerr << std::endl << "But we expected:" << std::endl;
        for (const auto& message : expected) {
            std::cerr << message << std::endl;
        }
        throw std::runtime_error("Unexpected stats");
    }
}